

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O2

u32 __thiscall moira::Moira::logic<(moira::Core)0,(moira::Instr)91,2>(Moira *this,u32 op1,u32 op2)

{
  uint uVar1;
  
  uVar1 = op1 | op2;
  (this->reg).sr.n = (bool)((byte)(uVar1 >> 0xf) & 1);
  (this->reg).sr.z = (short)uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return uVar1;
}

Assistant:

u32
Moira::logic(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

        case Instr::AND: case Instr::ANDI: case Instr::ANDICCR: case Instr::ANDISR: case Instr::AND_LOOP:

            result = op1 & op2;
            break;

        case Instr::OR: case Instr::ORI: case Instr::ORICCR: case Instr::ORISR: case Instr::OR_LOOP:

            result = op1 | op2;
            break;

        case Instr::EOR: case Instr::EORI: case Instr::EORICCR: case Instr::EORISR: case Instr::EOR_LOOP:

            result = op1 ^ op2;
            break;

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);
    reg.sr.z = ZERO<S>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;
    return result;
}